

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

char * arkLSGetReturnFlagName(long flag)

{
  char *__s;
  undefined8 in_RDI;
  char *name;
  
  __s = (char *)malloc(0x1e);
  switch(in_RDI) {
  case 0:
    sprintf(__s,"ARKLS_SUCCESS");
    break;
  case 0xfffffffffffffff4:
    sprintf(__s,"ARKLS_SUNLS_FAIL");
    break;
  case 0xfffffffffffffff5:
    sprintf(__s,"ARKLS_SUNMAT_FAIL");
    break;
  case 0xfffffffffffffff6:
    sprintf(__s,"ARKLS_MASSFUNC_RECVR");
    break;
  case 0xfffffffffffffff7:
    sprintf(__s,"ARKLS_MASSFUNC_UNRECVR");
    break;
  case 0xfffffffffffffff8:
    sprintf(__s,"ARKLS_JACFUNC_RECVR");
    break;
  case 0xfffffffffffffff9:
    sprintf(__s,"ARKLS_JACFUNC_UNRECVR");
    break;
  case 0xfffffffffffffffa:
    sprintf(__s,"ARKLS_MASSMEM_NULL");
    break;
  default:
    sprintf(__s,"NONE");
    break;
  case 0xfffffffffffffffc:
    sprintf(__s,"ARKLS_MEM_FAIL");
    break;
  case 0xfffffffffffffffd:
    sprintf(__s,"ARKLS_ILL_INPUT");
    break;
  case 0xfffffffffffffffe:
    sprintf(__s,"ARKLS_LMEM_NULL");
    break;
  case 0xffffffffffffffff:
    sprintf(__s,"ARKLS_MEM_NULL");
  }
  return __s;
}

Assistant:

char *arkLSGetReturnFlagName(long int flag)
{
  char *name = (char *)malloc(30*sizeof(char));

  switch(flag) {
  case ARKLS_SUCCESS:
    sprintf(name,"ARKLS_SUCCESS");
    break;
  case ARKLS_MEM_NULL:
    sprintf(name,"ARKLS_MEM_NULL");
    break;
  case ARKLS_LMEM_NULL:
    sprintf(name,"ARKLS_LMEM_NULL");
    break;
  case ARKLS_ILL_INPUT:
    sprintf(name,"ARKLS_ILL_INPUT");
    break;
  case ARKLS_MEM_FAIL:
    sprintf(name,"ARKLS_MEM_FAIL");
    break;
  case ARKLS_MASSMEM_NULL:
    sprintf(name,"ARKLS_MASSMEM_NULL");
    break;
  case ARKLS_JACFUNC_UNRECVR:
    sprintf(name,"ARKLS_JACFUNC_UNRECVR");
    break;
  case ARKLS_JACFUNC_RECVR:
    sprintf(name,"ARKLS_JACFUNC_RECVR");
    break;
  case ARKLS_MASSFUNC_UNRECVR:
    sprintf(name,"ARKLS_MASSFUNC_UNRECVR");
    break;
  case ARKLS_MASSFUNC_RECVR:
    sprintf(name,"ARKLS_MASSFUNC_RECVR");
    break;
  case ARKLS_SUNMAT_FAIL:
    sprintf(name,"ARKLS_SUNMAT_FAIL");
    break;
  case ARKLS_SUNLS_FAIL:
    sprintf(name,"ARKLS_SUNLS_FAIL");
    break;
  default:
    sprintf(name,"NONE");
  }

  return(name);
}